

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<unsigned_short,false>
               (char *buf,idx_t len,unsigned_short *result,bool strict)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  unsigned_short uVar4;
  undefined7 in_register_00000009;
  undefined8 uVar5;
  idx_t iVar6;
  short sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  unsigned_short uVar12;
  char *pcVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  char cVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  IntegerCastData<short> local_6a;
  IntegerDecimalCastData<unsigned_short> local_68;
  ulong local_48;
  undefined8 local_40;
  unsigned_short *local_38;
  
  uVar5 = CONCAT71(in_register_00000009,strict);
  uVar4 = (unsigned_short)uVar5;
  if (len != 0) {
    uVar16 = 0;
    do {
      bVar1 = buf[uVar16];
      uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar1);
      uVar4 = (unsigned_short)uVar5;
      uVar11 = (uint)bVar1;
      if ((4 < uVar11 - 9) && (uVar11 != 0x20)) {
        if (uVar11 == 0x2d) {
          uVar19 = len - uVar16;
          uVar17 = 1;
          goto LAB_001ecfe0;
        }
        if (bVar1 != 0x30 || len - 1 == uVar16) {
LAB_001ed1b0:
          local_40 = CONCAT44(local_40._4_4_,3);
          uVar19 = len - uVar16;
          local_48 = (ulong)(bVar1 == 0x2b);
          uVar11 = 0;
          uVar17 = local_48;
          goto LAB_001ed1cf;
        }
        cVar18 = buf[uVar16 + 1];
        if (cVar18 != 'B') {
          if (cVar18 != 'x') {
            if (cVar18 == 'b') goto LAB_001ed4a5;
            if (cVar18 != 'X') goto LAB_001ed1b0;
          }
          uVar4 = 0;
          uVar12 = 0;
          uVar17 = 1;
          goto LAB_001ed0a4;
        }
LAB_001ed4a5:
        uVar17 = ~uVar16 + len;
        bVar22 = 1 < uVar17;
        if (!bVar22) {
          uVar4 = 0;
          goto LAB_001ecfff;
        }
        uVar4 = 0;
        uVar19 = 1;
        goto LAB_001ed4bb;
      }
      uVar16 = uVar16 + 1;
    } while (len != uVar16);
  }
  bVar22 = false;
  goto LAB_001ecfff;
  while (lVar2 = uVar16 + uVar17, uVar17 = uVar17 + 1, buf[lVar2] == '0') {
LAB_001ecfe0:
    if (uVar19 <= uVar17) {
      uVar4 = 0;
      uVar17 = 1;
      goto LAB_001ed2b6;
    }
  }
  uVar4 = 0;
LAB_001ecff9:
  bVar22 = false;
  goto LAB_001ecfff;
  while( true ) {
    uVar14 = uVar17 + 1;
    bVar21 = true;
    if ((~uVar17 + len != uVar16) && (buf[uVar16 + 1 + uVar17] == '_')) {
      uVar14 = uVar17 + 2;
      if ((len - uVar17) - 2 == uVar16) {
        bVar21 = false;
      }
      else {
        bVar21 = (byte)(buf[uVar16 + uVar14] - 0x30U) < 10;
      }
    }
    uVar4 = uVar4 * 10 - (ushort)bVar1;
    bVar22 = false;
    uVar17 = uVar14;
    if (!bVar21) break;
LAB_001ed2b6:
    if (uVar19 <= uVar17) goto LAB_001eda5e;
    bVar1 = buf[uVar16 + uVar17] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar16 + uVar17] == '.') {
        uVar14 = uVar17 + 1;
        if (uVar14 < uVar19) {
          iVar9 = 0;
          if (9 < (byte)(buf[uVar16 + 1 + uVar17] - 0x30U)) goto LAB_001ed9f4;
          iVar10 = 1;
        }
        else {
          iVar9 = 3;
LAB_001ed9f4:
          iVar10 = 1;
          if (1 < uVar17) {
            iVar10 = iVar9;
          }
        }
        uVar17 = uVar14;
        if (iVar10 == 3) goto LAB_001eda5e;
        if (iVar10 != 0) goto LAB_001ecff9;
      }
      bVar22 = false;
      if (((ulong)(byte)buf[uVar16 + uVar17] < 0x21) &&
         (bVar22 = false, (0x100003e00U >> ((ulong)(byte)buf[uVar16 + uVar17] & 0x3f) & 1) != 0)) {
        uVar14 = uVar17 + 1;
        uVar17 = uVar14;
        if (uVar19 <= uVar14) goto LAB_001eda5e;
        goto LAB_001eda36;
      }
      break;
    }
  }
  goto LAB_001ecfff;
  while (uVar14 = uVar14 + 1, uVar17 = uVar19, uVar19 != uVar14) {
LAB_001eda36:
    if ((0x20 < (ulong)(byte)buf[uVar16 + uVar14]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar16 + uVar14] & 0x3f) & 1) == 0)) goto LAB_001ecff9;
  }
LAB_001eda5e:
  bVar22 = 1 < uVar17;
  goto LAB_001ecfff;
  while( true ) {
    uVar14 = uVar17 + 1;
    bVar21 = false;
    if ((uVar11 & 0xffff) <= (uint)(((ulong)uVar8 & 0xffffffff000000ff ^ 0xfffe) / 10)) {
      uVar11 = (uVar11 & 0xffff) * 10 + (uVar8 & 0xff);
      bVar21 = true;
      if ((~uVar17 + len != uVar16) && (buf[uVar16 + 1 + uVar17] == '_')) {
        uVar14 = uVar17 + 2;
        if ((len - uVar17) - 2 == uVar16) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(buf[uVar16 + uVar14] - 0x30U) < 10;
        }
      }
    }
    uVar4 = (unsigned_short)uVar11;
    bVar22 = false;
    uVar17 = uVar14;
    if (!bVar21) break;
LAB_001ed1cf:
    uVar4 = (unsigned_short)uVar11;
    if (uVar19 <= uVar17) goto LAB_001ed773;
    uVar8 = (byte)buf[uVar16 + uVar17] - 0x30;
    if (9 < (byte)uVar8) {
      if (buf[uVar16 + uVar17] == 0x2e) {
        uVar14 = uVar17 + 1;
        if ((uVar14 < uVar19) &&
           (local_40 = (ulong)local_40._4_4_ << 0x20, (byte)(buf[uVar16 + 1 + uVar17] - 0x30U) < 10)
           ) {
          iVar9 = 1;
        }
        else {
          iVar9 = 1;
          if (local_48 < uVar17) {
            iVar9 = (int)local_40;
          }
        }
        uVar17 = uVar14;
        if (iVar9 == 3) goto LAB_001ed773;
        if (iVar9 != 0) goto LAB_001ecff9;
      }
      bVar22 = false;
      if (((ulong)(byte)buf[uVar16 + uVar17] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar16 + uVar17] & 0x3f) & 1) != 0)) {
        uVar14 = uVar17 + 1;
        uVar17 = uVar14;
        if (uVar19 <= uVar14) goto LAB_001ed773;
        goto LAB_001ed74b;
      }
      break;
    }
  }
  goto LAB_001ecfff;
  while (uVar14 = uVar14 + 1, uVar17 = uVar19, uVar19 != uVar14) {
LAB_001ed74b:
    if ((0x20 < (ulong)(byte)buf[uVar16 + uVar14]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar16 + uVar14] & 0x3f) & 1) == 0)) goto LAB_001ecff9;
  }
LAB_001ed773:
  bVar22 = local_48 < uVar17;
  goto LAB_001ecfff;
LAB_001ed0a4:
  do {
    if (~uVar16 + len <= uVar17) goto LAB_001eda5e;
    bVar1 = buf[uVar16 + 1 + uVar17];
    bVar15 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar15 = bVar1;
    }
    if (9 < (byte)(bVar15 - 0x30)) {
      bVar22 = false;
      if ((0x25 < bVar15 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar15 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar18 = -0x57;
    if ((char)bVar15 < 'a') {
      cVar18 = -0x30;
    }
    uVar19 = uVar17 + 1;
    if (((len - uVar17) - 2 == uVar16) || (buf[uVar16 + 2 + uVar17] != '_')) {
LAB_001ed16f:
      bVar21 = uVar12 <= (ushort)((byte)(cVar18 + bVar15) >> 4 ^ 0xfff);
      if (bVar21) {
        uVar12 = uVar12 * 0x10 + (ushort)(byte)(cVar18 + bVar15);
        uVar4 = uVar12;
      }
    }
    else {
      uVar19 = uVar17 + 2;
      if ((len - uVar17) - 3 != uVar16) {
        if (9 < (byte)(buf[uVar16 + 3 + uVar17] - 0x30U)) {
          bVar21 = false;
          uVar11 = (byte)buf[uVar16 + 3 + uVar17] - 0x41;
          if ((0x25 < uVar11) || ((0x3f0000003fU >> ((ulong)uVar11 & 0x3f) & 1) == 0))
          goto LAB_001ed1a0;
        }
        goto LAB_001ed16f;
      }
      bVar21 = false;
    }
LAB_001ed1a0:
    bVar22 = false;
    uVar17 = uVar19;
  } while (bVar21);
  goto LAB_001ecfff;
  while (lVar2 = uVar16 + uVar19, uVar19 = uVar19 + 1, buf[lVar2] == '0') {
LAB_001ed294:
    if (uVar17 <= uVar19) {
      uVar19 = 1;
      local_68.result = 0;
      goto LAB_001ed65e;
    }
  }
  goto LAB_001ed038;
  while( true ) {
    bVar1 = buf[uVar16 + uVar19] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar16 + uVar19] != '.') goto LAB_001edbd7;
      uVar14 = uVar19 + 1;
      if (uVar17 <= uVar14) {
        iVar9 = 3;
        uVar20 = uVar14;
        goto LAB_001edbb1;
      }
      local_68.decimal = 0;
      uVar3 = uVar14;
      goto LAB_001ed964;
    }
    uVar14 = uVar19 + 1;
    if (local_68.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar22 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar1;
      bVar22 = true;
      if ((~uVar19 + len != uVar16) && (buf[uVar16 + 1 + uVar19] == '_')) {
        uVar14 = uVar19 + 2;
        if ((len - uVar19) - 2 == uVar16) {
          bVar22 = false;
        }
        else {
          bVar22 = (byte)(buf[uVar16 + uVar14] - 0x30U) < 10;
        }
      }
    }
    uVar19 = uVar14;
    if (!bVar22) break;
LAB_001ed65e:
    if (uVar17 <= uVar19) goto LAB_001ed91a;
  }
  goto LAB_001ed036;
  while (uVar3 = uVar20, uVar20 < uVar17) {
LAB_001ed964:
    bVar1 = buf[uVar16 + uVar3] - 0x30;
    local_48 = uVar14;
    if (9 < bVar1) {
      iVar9 = 0;
      goto LAB_001edba2;
    }
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar20 = uVar3 + 1;
    if (((~uVar3 + len != uVar16) && (buf[uVar16 + 1 + uVar3] == '_')) &&
       ((uVar20 = uVar3 + 2, (len - uVar3) - 2 == uVar16 ||
        (9 < (byte)(buf[uVar16 + uVar20] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar10 = 1;
      goto LAB_001edbc6;
    }
  }
  iVar9 = 3;
LAB_001edba2:
  local_68._18_6_ = 0;
  uVar20 = uVar3;
LAB_001edbb1:
  iVar10 = 1;
  if (uVar14 < uVar20) {
    iVar10 = iVar9;
  }
  if (1 < uVar19) {
    iVar10 = iVar9;
  }
LAB_001edbc6:
  uVar19 = uVar20;
  if (iVar10 == 3) {
LAB_001ed91a:
    bVar22 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>(&local_68);
    if (bVar22) {
      bVar22 = 1 < uVar19;
      goto LAB_001ed038;
    }
  }
  else if (iVar10 == 0) {
LAB_001edbd7:
    bVar1 = buf[uVar16 + uVar19];
    if (bVar1 - 9 < 5) {
LAB_001edbe9:
      uVar14 = uVar19 + 1;
      uVar19 = uVar14;
      if (uVar14 < uVar17) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar16 + uVar14]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar16 + uVar14] & 0x3f) & 1) == 0))
          goto LAB_001ed036;
          uVar14 = uVar14 + 1;
          uVar19 = uVar17;
        } while (uVar17 != uVar14);
      }
      goto LAB_001ed91a;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar19 != 1) && (uVar19 + 1 < uVar17)) {
        local_6a.result = 0;
        pcVar13 = buf + uVar16 + uVar19 + 1;
        iVar6 = ~uVar16 + (len - uVar19);
        if (*pcVar13 == '-') {
          bVar22 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,iVar6,&local_6a,SUB81(iVar6,0));
        }
        else {
          bVar22 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,iVar6,&local_6a,SUB81(iVar6,0));
        }
        if (bVar22 != false) {
          bVar22 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                             (&local_68,local_6a.result);
          goto LAB_001ed038;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_001edbe9;
  }
  goto LAB_001ed036;
  while( true ) {
    bVar1 = buf[uVar16 + uVar19] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar16 + uVar19] != '.') goto LAB_001edaf3;
      uVar14 = uVar19 + 1;
      if (uVar17 <= uVar14) {
        iVar9 = 3;
        uVar20 = uVar14;
        goto LAB_001edacc;
      }
      local_68.decimal = 0;
      uVar3 = uVar14;
      goto LAB_001ed88d;
    }
    uVar14 = uVar19 + 1;
    bVar22 = false;
    if (local_68.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar1;
      bVar22 = true;
      if ((~uVar19 + len != uVar16) && (buf[uVar16 + 1 + uVar19] == '_')) {
        uVar14 = uVar19 + 2;
        if ((len - uVar19) - 2 == uVar16) {
          bVar22 = false;
        }
        else {
          bVar22 = (byte)(buf[uVar16 + uVar14] - 0x30U) < 10;
        }
      }
    }
    uVar19 = uVar14;
    if (!bVar22) break;
LAB_001ed58f:
    if (uVar17 <= uVar19) goto LAB_001ed786;
  }
  goto LAB_001ed036;
  while (uVar3 = uVar20, uVar20 < uVar17) {
LAB_001ed88d:
    bVar1 = buf[uVar16 + uVar3] - 0x30;
    local_40 = uVar14;
    if (9 < bVar1) {
      iVar9 = 0;
      goto LAB_001edabc;
    }
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar20 = uVar3 + 1;
    if (((~uVar3 + len != uVar16) && (buf[uVar16 + 1 + uVar3] == '_')) &&
       ((uVar20 = uVar3 + 2, (len - uVar3) - 2 == uVar16 ||
        (9 < (byte)(buf[uVar16 + uVar20] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar10 = 1;
      goto LAB_001edae2;
    }
  }
  iVar9 = 3;
LAB_001edabc:
  local_68._18_6_ = 0;
  uVar20 = uVar3;
LAB_001edacc:
  iVar10 = 1;
  if (uVar14 < uVar20) {
    iVar10 = iVar9;
  }
  if (local_48 < uVar19) {
    iVar10 = iVar9;
  }
LAB_001edae2:
  uVar19 = uVar20;
  if (iVar10 == 3) {
LAB_001ed786:
    bVar22 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_68);
    if (bVar22) {
      bVar22 = local_48 < uVar19;
      goto LAB_001ed038;
    }
  }
  else if (iVar10 == 0) {
LAB_001edaf3:
    bVar1 = buf[uVar16 + uVar19];
    if (bVar1 - 9 < 5) {
LAB_001edb05:
      uVar14 = uVar19 + 1;
      uVar19 = uVar14;
      if (uVar14 < uVar17) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar16 + uVar14]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar16 + uVar14] & 0x3f) & 1) == 0))
          goto LAB_001ed036;
          uVar14 = uVar14 + 1;
          uVar19 = uVar17;
        } while (uVar17 != uVar14);
      }
      goto LAB_001ed786;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar19 != local_48) && (uVar19 + 1 < uVar17)) {
        local_6a.result = 0;
        pcVar13 = buf + uVar16 + uVar19 + 1;
        iVar6 = ~uVar16 + (len - uVar19);
        if (*pcVar13 == '-') {
          bVar22 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,iVar6,&local_6a,SUB81(iVar6,0));
        }
        else {
          bVar22 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar13,iVar6,&local_6a,SUB81(iVar6,0));
        }
        if (bVar22 != false) {
          bVar22 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                             (&local_68,local_6a.result);
          goto LAB_001ed038;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_001edb05;
  }
  goto LAB_001ed036;
LAB_001ed391:
  do {
    if (~uVar16 + len <= uVar17) {
      bVar22 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_68);
      bVar22 = 1 < uVar17 && bVar22;
      goto LAB_001ed038;
    }
    bVar1 = buf[uVar16 + 1 + uVar17];
    bVar15 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar15 = bVar1;
    }
    if ((9 < (byte)(bVar15 - 0x30)) &&
       ((0x25 < bVar15 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar15 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar18 = -0x57;
    if ((char)bVar15 < 'a') {
      cVar18 = -0x30;
    }
    uVar19 = uVar17 + 1;
    if (((len - uVar17) - 2 == uVar16) || (buf[uVar16 + 2 + uVar17] != '_')) {
LAB_001ed45e:
      uVar17 = (ulong)((byte)(cVar18 + bVar15) >> 4) ^ 0x7ffffffffffffff;
      lVar2 = local_68.result;
      if (local_68.result <= (long)uVar17) {
        lVar2 = local_68.result * 0x10 + (ulong)(byte)(cVar18 + bVar15);
      }
      bVar22 = local_68.result <= (long)uVar17;
      local_68.result = lVar2;
    }
    else {
      uVar19 = uVar17 + 2;
      if ((len - uVar17) - 3 != uVar16) {
        if (9 < (byte)(buf[uVar16 + 3 + uVar17] - 0x30U)) {
          uVar11 = (byte)buf[uVar16 + 3 + uVar17] - 0x41;
          bVar22 = false;
          if ((0x25 < uVar11) ||
             (bVar22 = false, (0x3f0000003fU >> ((ulong)uVar11 & 0x3f) & 1) == 0))
          goto LAB_001ed485;
        }
        goto LAB_001ed45e;
      }
      bVar22 = false;
    }
LAB_001ed485:
    uVar17 = uVar19;
  } while (bVar22);
  goto LAB_001ed036;
  while( true ) {
    uVar19 = uVar3;
    if (0x3fffffffffffffff < local_68.result) goto LAB_001ed036;
    local_68.result = uVar14 + local_68.result * 2;
    if (uVar17 <= uVar19) break;
LAB_001ed7ce:
    if (buf[uVar16 + 1 + uVar19] == '0') {
      uVar14 = 0;
    }
    else {
      uVar14 = 1;
      if (buf[uVar16 + 1 + uVar19] != '1') goto LAB_001ed036;
    }
    uVar3 = uVar19 + 1;
    if (((len - uVar19) - 2 != uVar16) && (buf[uVar16 + 2 + uVar19] == '_')) {
      if (((len - uVar19) - 3 == uVar16) || ((buf[uVar16 + 3 + uVar19] & 0xfeU) != 0x30))
      goto LAB_001ed036;
      uVar3 = uVar19 + 2;
    }
  }
LAB_001ed848:
  bVar22 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_68);
  bVar22 = bVar22 && 1 < uVar17;
  goto LAB_001ed038;
  while( true ) {
    uVar14 = uVar19 + 1;
    if (((len - uVar19) - 2 != uVar16) && (buf[uVar16 + 2 + uVar19] == '_')) {
      if (((len - uVar19) - 3 == uVar16) || ((buf[uVar16 + 3 + uVar19] & 0xfeU) != 0x30))
      goto LAB_001ecff9;
      uVar14 = uVar19 + 2;
    }
    if ((short)uVar4 < 0) goto LAB_001ecff9;
    uVar4 = sVar7 + uVar4 * 2;
    bVar22 = true;
    uVar19 = uVar14;
    if (uVar17 <= uVar14) break;
LAB_001ed4bb:
    sVar7 = 0;
    bVar22 = false;
    if (buf[uVar16 + 1 + uVar19] != '0') {
      if (buf[uVar16 + 1 + uVar19] != '1') break;
      sVar7 = 1;
    }
  }
LAB_001ecfff:
  if (bVar22) {
    *result = uVar4;
    bVar22 = true;
  }
  else {
    local_38 = result;
    if (len != 0) {
      uVar16 = 0;
      do {
        bVar1 = buf[uVar16];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar17 = len - uVar16;
          local_68.decimal_digits = 0;
          if (bVar1 == 0x2d) {
            bVar22 = false;
            uVar19 = 1;
            goto LAB_001ed294;
          }
          if (bVar1 != 0x30 || len - 1 == uVar16) {
LAB_001ed57c:
            local_48 = (ulong)(bVar1 == 0x2b);
            local_68.result = 0;
            uVar19 = local_48;
            goto LAB_001ed58f;
          }
          cVar18 = buf[uVar16 + 1];
          if (cVar18 != 'B') {
            if (cVar18 != 'x') {
              if (cVar18 == 'b') goto LAB_001ed7a5;
              if (cVar18 != 'X') goto LAB_001ed57c;
            }
            local_68.result = 0;
            uVar17 = 1;
            goto LAB_001ed391;
          }
LAB_001ed7a5:
          uVar17 = ~uVar16 + len;
          if (uVar17 < 2) goto LAB_001ed848;
          local_68.result = 0;
          uVar19 = 1;
          goto LAB_001ed7ce;
        }
        uVar16 = uVar16 + 1;
      } while (len != uVar16);
    }
LAB_001ed036:
    bVar22 = false;
LAB_001ed038:
    if (bVar22 != false) {
      *local_38 = (unsigned_short)local_68.result;
    }
  }
  return bVar22;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}